

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkImageScaler::SerializeWithCachedSizes
          (NeuralNetworkImageScaler *this,CodedOutputStream *output)

{
  float fVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NeuralNetworkImageScaler *this_local;
  
  fVar1 = channelscale(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = channelscale(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(10,fVar1,output);
  }
  fVar1 = bluebias(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = bluebias(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x14,fVar1,output);
  }
  fVar1 = greenbias(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = greenbias(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x15,fVar1,output);
  }
  fVar1 = redbias(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = redbias(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x16,fVar1,output);
  }
  fVar1 = graybias(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = graybias(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x1e,fVar1,output);
  }
  return;
}

Assistant:

void NeuralNetworkImageScaler::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetworkImageScaler)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float channelScale = 10;
  if (this->channelscale() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(10, this->channelscale(), output);
  }

  // float blueBias = 20;
  if (this->bluebias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(20, this->bluebias(), output);
  }

  // float greenBias = 21;
  if (this->greenbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(21, this->greenbias(), output);
  }

  // float redBias = 22;
  if (this->redbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(22, this->redbias(), output);
  }

  // float grayBias = 30;
  if (this->graybias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(30, this->graybias(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetworkImageScaler)
}